

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkStartFromNoLatches(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *pVVar6;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_NtkFunc_t Func_local;
  Abc_NtkType_t Type_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (Type == ABC_NTK_NETLIST) {
      __assert_fail("Type != ABC_NTK_NETLIST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x106,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
    pNtk_local = Abc_NtkAlloc(Type,Func,1);
    pNtk_local->nConstrs = pNtk->nConstrs;
    pNtk_local->nBarBufs = pNtk->nBarBufs;
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar3;
    Abc_NtkCleanCopy(pNtk);
    iVar1 = Abc_NtkIsStrash(pNtk);
    if ((iVar1 != 0) && (iVar1 = Abc_NtkIsStrash(pNtk_local), iVar1 != 0)) {
      pAVar4 = Abc_AigConst1(pNtk_local);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_6).pCopy = pAVar4;
    }
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_34);
      Abc_NtkDupObj(pNtk_local,pAVar4,1);
    }
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,local_34);
      Abc_NtkDupObj(pNtk_local,pAVar4,1);
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_34);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 == 0) {
        Abc_NtkDupBox(pNtk_local,pAVar4,1);
      }
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      pVVar6 = Vec_IntDup(pNtk->vObjPerm);
      pNtk_local->vObjPerm = pVVar6;
    }
    pNtk_local->AndGateDelay = pNtk->AndGateDelay;
    Abc_ManTimeDup(pNtk,pNtk_local);
    iVar1 = Abc_NtkPiNum(pNtk);
    iVar2 = Abc_NtkPiNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x125,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
    iVar1 = Abc_NtkPoNum(pNtk);
    iVar2 = Abc_NtkPoNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x126,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFromNoLatches( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk == NULL )
        return NULL;
    assert( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_NtkDupBox(pNtkNew, pObj, 1);
    }
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    // transfer the names
//    Abc_NtkTrasferNamesNoLatches( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    return pNtkNew;
}